

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O1

void __thiscall BufferedReader::thread_main(BufferedReader *this)

{
  uint8_t *puVar1;
  map<int,_ReaderData_*,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
  *this_00;
  int iVar2;
  int iVar3;
  int iVar4;
  ReaderData *pRVar5;
  WaitableSafeQueue<int> *this_01;
  pthread_mutex_t *__mutex;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_ReaderData_*>_>,_std::_Rb_tree_iterator<std::pair<const_int,_ReaderData_*>_>_>
  pVar6;
  int readerID;
  string nextFileName;
  int local_74;
  long *local_70;
  size_t local_68;
  long local_60 [2];
  condition_variable *local_50;
  WaitableSafeQueue<int> *local_48;
  pthread_mutex_t *local_40;
  map<int,_ReaderData_*,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
  *local_38;
  
  this_01 = &this->m_readQueue;
  local_50 = &this->m_readCond;
  __mutex = (pthread_mutex_t *)&this->m_readersMtx;
  local_38 = &this->m_readers;
  local_48 = this_01;
  local_40 = __mutex;
  do {
    do {
      if ((this->m_terminated != false) ||
         (local_74 = WaitableSafeQueue<int>::pop(this_01), this->m_terminated != false)) {
        return;
      }
      pRVar5 = getReader(this,local_74);
    } while (pRVar5 == (ReaderData *)0x0);
    if (pRVar5->m_deleted == false) {
      iVar4 = pRVar5->m_readOffset;
      puVar1 = pRVar5->m_nextBlock[pRVar5->m_bufferIndex];
      iVar2 = (*pRVar5->_vptr_ReaderData[5])(pRVar5,puVar1 + iVar4,(ulong)pRVar5->m_blockSize);
      if (pRVar5->m_lastBlock == true) {
        pRVar5->m_firstBlock = true;
        pRVar5->m_lastBlock = false;
      }
      else if (pRVar5->m_firstBlock == true) {
        pRVar5->m_firstBlock = false;
      }
      if ((iVar2 < 1) ||
         ((iVar2 < (int)pRVar5->m_blockSize && (pRVar5->itr != (FileNameIterator *)0x0)))) {
        if (pRVar5->itr == (FileNameIterator *)0x0) {
          pRVar5->m_eof = true;
        }
        else {
          (**pRVar5->itr->_vptr_FileNameIterator)(&local_70);
          if ((local_68 != (pRVar5->m_streamName)._M_string_length) ||
             ((local_68 != 0 &&
              (iVar3 = bcmp(local_70,(pRVar5->m_streamName)._M_dataplus._M_p,local_68), iVar3 != 0))
             )) {
            (*pRVar5->_vptr_ReaderData[6])(pRVar5);
            std::__cxx11::string::_M_assign((string *)&pRVar5->m_streamName);
            if (((pRVar5->m_streamName)._M_string_length == 0) ||
               (iVar3 = (*pRVar5->_vptr_ReaderData[4])(pRVar5), (char)iVar3 == '\0')) {
              pRVar5->m_eof = true;
            }
            else if (iVar2 == 0) {
              pRVar5->m_firstBlock = true;
              iVar2 = (*pRVar5->_vptr_ReaderData[5])
                                (pRVar5,puVar1 + iVar4,
                                 (ulong)(this->super_AbstractReader).m_blockSize);
              if (iVar2 < (int)(this->super_AbstractReader).m_blockSize) {
                pRVar5->m_lastBlock = true;
                pRVar5->m_eof = true;
              }
            }
            else {
              pRVar5->m_lastBlock = true;
            }
          }
          if (local_70 != local_60) {
            operator_delete(local_70,local_60[0] + 1);
          }
        }
      }
      pRVar5->m_blockSize = (this->super_AbstractReader).m_blockSize;
      if (iVar2 == 0) {
        pRVar5->m_eof = true;
      }
      iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->m_readMtx);
      if (iVar4 != 0) {
        std::__throw_system_error(iVar4);
      }
      pRVar5->m_nextBlockSize = iVar2;
      std::condition_variable::notify_one();
      pthread_mutex_unlock((pthread_mutex_t *)&this->m_readMtx);
      this_01 = local_48;
      __mutex = local_40;
    }
    iVar4 = pthread_mutex_lock(__mutex);
    if (iVar4 != 0) {
      std::__throw_system_error(iVar4);
    }
    iVar4 = pRVar5->m_atQueue + -1;
    pRVar5->m_atQueue = iVar4;
    if ((iVar4 == 0 & pRVar5->m_deleted) == 1) {
      (*pRVar5->_vptr_ReaderData[1])(pRVar5);
      this_00 = local_38;
      pVar6 = std::
              _Rb_tree<int,_std::pair<const_int,_ReaderData_*>,_std::_Select1st<std::pair<const_int,_ReaderData_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
              ::equal_range(&local_38->_M_t,&local_74);
      std::
      _Rb_tree<int,_std::pair<const_int,_ReaderData_*>,_std::_Select1st<std::pair<const_int,_ReaderData_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
      ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar6.first._M_node,(_Base_ptr)pVar6.second._M_node);
    }
    pthread_mutex_unlock(__mutex);
  } while( true );
}

Assistant:

void BufferedReader::thread_main()
{
    try
    {
        while (!m_terminated)
        {
            const int readerID = m_readQueue.pop();
            if (m_terminated)
            {
                break;
            }
            ReaderData* data = getReader(readerID);
            if (data)
            {
                uint8_t* buffer = data->m_nextBlock[data->m_bufferIndex] + data->m_readOffset;
                if (!data->m_deleted)
                {
                    int bytesReaded = data->readBlock(buffer, data->m_blockSize);
                    if (data->m_lastBlock)
                    {
                        data->m_lastBlock = false;
                        data->m_firstBlock = true;
                    }
                    else if (data->m_firstBlock)
                    {
                        data->m_firstBlock = false;
                    }

                    if (bytesReaded <= 0 || (bytesReaded < static_cast<int>(data->m_blockSize) && data->itr))
                    {
                        if (data->itr)
                        {
                            std::string nextFileName = data->itr->getNextName();
                            if (nextFileName != data->m_streamName)
                            {
                                data->closeStream();
                                data->m_streamName = nextFileName;
                                if (!data->m_streamName.empty() && data->openStream())
                                {
                                    if (bytesReaded == 0)
                                    {
                                        // data->m_nextFileInfo = NEXT_FILE_FIRST_BLOCK;
                                        data->m_firstBlock = true;
                                        bytesReaded = data->readBlock(buffer, m_blockSize);
                                        if (bytesReaded < static_cast<int>(m_blockSize))
                                        {
                                            data->m_eof = true;
                                            data->m_lastBlock = true;
                                        }
                                    }
                                    else
                                    {
                                        data->m_lastBlock = true;
                                    }
                                }
                                else
                                    data->m_eof = true;
                            }
                        }
                        else
                        {
                            data->m_eof = true;
                        }
                    }

                    data->m_blockSize = m_blockSize;
                    if (bytesReaded == 0)
                    {
                        data->m_eof = true;
                    }

                    {
                        std::lock_guard lk(m_readMtx);
                        data->m_nextBlockSize = bytesReaded;
                        m_readCond.notify_one();
                    }
                }

                {
                    std::lock_guard lock(m_readersMtx);
                    data->m_atQueue--;
                    if (data->m_deleted && data->m_atQueue == 0)
                    {
                        delete data;
                        m_readers.erase(readerID);
                    }
                }
            }
        }
    }
    catch (std::exception& e)
    {
        LTRACE(LT_ERROR, 0, "BufferedReader::thread_main() throws exception: " << e.what());
    }
    catch (...)
    {
        LTRACE(LT_ERROR, 0, "BufferedReader::thread_main() throws unknown exception");
    }
}